

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O2

int smem_open(char *filename,int rwmode,int *driverhandle)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int h;
  undefined8 uStack_18;
  
  iVar2 = 0x98;
  if (driverhandle != (int *)0x0 && filename != (char *)0x0) {
    uStack_18 = 0x98;
    iVar1 = __isoc99_sscanf(filename,"h%d",(long)&uStack_18 + 4);
    iVar2 = 0x97;
    if (iVar1 == 1) {
      iVar2 = shared_attach(uStack_18._4_4_);
      if (iVar2 == 0) {
        piVar3 = (int *)shared_lock(uStack_18._4_4_,(uint)(rwmode == 1));
        if (piVar3 != (int *)0x0) {
          if ((uStack_18._4_4_ == piVar3[1]) && (*piVar3 == 0x19630114)) {
            *driverhandle = uStack_18._4_4_;
            return 0;
          }
          shared_unlock(uStack_18._4_4_);
        }
        shared_free(uStack_18._4_4_);
        iVar2 = 0x97;
      }
    }
  }
  return iVar2;
}

Assistant:

int     smem_open(char *filename, int rwmode, int *driverhandle)
 { int h, nitems, r;
   DAL_SHM_SEGHEAD *sp;


   if (NULL == filename) return(SHARED_NULPTR);
   if (NULL == driverhandle) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (SHARED_OK != (r = shared_attach(h))) return(r);

   if (NULL == (sp = (DAL_SHM_SEGHEAD *)shared_lock(h,
                ((READWRITE == rwmode) ? SHARED_RDWRITE : SHARED_RDONLY))))
     {  shared_free(h);
        return(SHARED_BADARG);
     }

   if ((h != sp->h) || (DAL_SHM_SEGHEAD_ID != sp->ID))
     { shared_unlock(h);
       shared_free(h);

       return(SHARED_BADARG);
     }

   *driverhandle = h;
   return(0);
 }